

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O3

int chrono::collision::ChGeometryCollider::ComputeSphereBoxCollisions
              (ChSphere *mgeo1,Vector *c1,ChBox *mgeo2,ChMatrix33<double> *R2,Vector *T2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection,bool swap_pairs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [32];
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  bool bVar30;
  undefined1 auVar31 [32];
  int i;
  int ipoint;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  Vector relC;
  ChCollisionPair temp;
  Vector pt_1;
  Vector pt_2;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double local_120;
  double local_118;
  ChCollisionPair local_f8;
  undefined1 local_88 [16];
  ChVector<float> local_6c;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  ChTransform<double>::TransformParentToLocal(c1,T2,R2);
  dVar67 = (mgeo2->Size).m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar67;
  dVar63 = mgeo1->rad;
  local_148._8_8_ = 0;
  local_148._0_8_ = local_128;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_120;
  auVar34._8_8_ = 0x7fffffffffffffff;
  auVar34._0_8_ = 0x7fffffffffffffff;
  auVar34 = vandpd_avx512vl(local_148,auVar34);
  dVar32 = auVar34._0_8_;
  if (just_intersection) {
    if (dVar32 <= dVar67 + dVar63) {
      auVar14._8_8_ = 0x7fffffffffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar34 = vandpd_avx512vl(auVar53,auVar14);
      dVar50 = auVar34._0_8_;
      dVar33 = (mgeo2->Size).m_data[1];
      if ((dVar50 <= dVar33) &&
         (auVar54._8_8_ = 0, auVar54._0_8_ = local_118, auVar15._8_8_ = 0x7fffffffffffffff,
         auVar15._0_8_ = 0x7fffffffffffffff, auVar34 = vandpd_avx512vl(auVar54,auVar15),
         auVar34._0_8_ <= (mgeo2->Size).m_data[2])) goto LAB_00836946;
    }
    else {
      dVar33 = (mgeo2->Size).m_data[1];
      auVar11._8_8_ = 0x7fffffffffffffff;
      auVar11._0_8_ = 0x7fffffffffffffff;
      auVar34 = vandpd_avx512vl(auVar53,auVar11);
      dVar50 = auVar34._0_8_;
    }
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_118;
    if ((dVar67 < dVar32) || (dVar63 + dVar33 < dVar50)) {
      dVar60 = (mgeo2->Size).m_data[2];
      auVar13._8_8_ = 0x7fffffffffffffff;
      auVar13._0_8_ = 0x7fffffffffffffff;
      auVar34 = vandpd_avx512vl(auVar55,auVar13);
      dVar52 = auVar34._0_8_;
    }
    else {
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar34 = vandpd_avx512vl(auVar55,auVar12);
      dVar60 = (mgeo2->Size).m_data[2];
      dVar52 = auVar34._0_8_;
      if (dVar52 <= dVar60) goto LAB_00836946;
    }
    if (((dVar63 + dVar60 < dVar52) || (dVar33 < dVar50)) || (dVar67 < dVar32)) {
      dVar7 = (dVar32 - dVar67) * (dVar32 - dVar67);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar7 + (dVar50 - dVar33) * (dVar50 - dVar33);
      auVar34 = vsqrtsd_avx(auVar59,auVar59);
      if ((dVar63 < auVar34._0_8_) || (dVar60 < dVar52)) {
        dVar33 = (mgeo2->Size).m_data[1];
        dVar60 = (dVar52 - dVar60) * (dVar52 - dVar60);
        dVar52 = dVar50 - dVar33;
        dVar52 = dVar52 * dVar52;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = dVar52 + dVar60;
        auVar34 = vsqrtsd_avx(auVar62,auVar62);
        if (((dVar63 < auVar34._0_8_) || (dVar67 < dVar32)) &&
           (((auVar39._8_8_ = 0, auVar39._0_8_ = dVar60 + dVar7,
             auVar34 = vsqrtsd_avx(auVar39,auVar39), dVar63 < auVar34._0_8_ || (dVar33 < dVar50)) &&
            (auVar40._8_8_ = 0, auVar40._0_8_ = dVar7 + dVar52 + dVar60,
            auVar34 = vsqrtsd_avx(auVar40,auVar40), dVar63 < auVar34._0_8_)))) {
          return 0;
        }
      }
    }
LAB_00836946:
    ChCollisionPair::ChCollisionPair(&local_f8,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2);
    ChNarrowPhaseCollider::AddCollisionPair(mcollider,&local_f8);
    return 1;
  }
  if (dVar32 <= dVar67 + dVar63) {
    auVar35._8_8_ = 0x7fffffffffffffff;
    auVar35._0_8_ = 0x7fffffffffffffff;
    auVar34 = vandpd_avx512vl(auVar53,auVar35);
    dVar50 = auVar34._0_8_;
    dVar33 = (mgeo2->Size).m_data[1];
    auVar69 = ZEXT864((ulong)dVar33);
    if (dVar33 < dVar50) goto LAB_00836838;
    local_138._8_8_ = 0;
    local_138._0_8_ = local_118;
    auVar29._8_8_ = 0x7fffffffffffffff;
    auVar29._0_8_ = 0x7fffffffffffffff;
    auVar34 = vandpd_avx512vl(local_138,auVar29);
    if ((mgeo2->Size).m_data[2] < auVar34._0_8_) goto LAB_00836838;
    if (local_128 < 0.0) {
LAB_00836a7b:
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      local_148 = vxorpd_avx512vl(auVar38,auVar26);
LAB_00836a85:
      bVar30 = true;
      auVar69 = ZEXT1664(auVar53);
      goto LAB_00836b55;
    }
LAB_00836b4b:
    bVar30 = true;
    auVar69 = ZEXT1664(auVar53);
    local_148 = auVar38;
  }
  else {
    auVar69 = ZEXT864((ulong)(mgeo2->Size).m_data[1]);
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    auVar34 = vandpd_avx512vl(auVar53,auVar16);
    dVar50 = auVar34._0_8_;
LAB_00836838:
    dVar33 = auVar69._0_8_;
    local_138._8_8_ = 0;
    local_138._0_8_ = local_118;
    auVar34 = auVar69._0_16_;
    if (dVar50 <= dVar33 + dVar63) {
      auVar27._8_8_ = 0x7fffffffffffffff;
      auVar27._0_8_ = 0x7fffffffffffffff;
      auVar35 = vandpd_avx512vl(local_138,auVar27);
      dVar52 = auVar35._0_8_;
      dVar60 = (mgeo2->Size).m_data[2];
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar60;
      if ((dVar67 < dVar32) || (dVar60 < dVar52)) goto LAB_0083685c;
      if (local_120 < 0.0) {
        auVar28._8_8_ = 0x8000000000000000;
        auVar28._0_8_ = 0x8000000000000000;
        auVar34 = vxorpd_avx512vl(auVar34,auVar28);
        auVar69 = ZEXT1664(auVar34);
      }
    }
    else {
      auVar61._8_8_ = 0;
      auVar61._0_8_ = (mgeo2->Size).m_data[2];
      auVar17._8_8_ = 0x7fffffffffffffff;
      auVar17._0_8_ = 0x7fffffffffffffff;
      auVar35 = vandpd_avx512vl(local_138,auVar17);
      dVar52 = auVar35._0_8_;
LAB_0083685c:
      dVar60 = auVar61._0_8_;
      if (((dVar63 + dVar60 < dVar52) || (dVar33 < dVar50)) || (dVar67 < dVar32)) {
        dVar7 = (dVar32 - dVar67) * (dVar32 - dVar67);
        dVar8 = (dVar50 - dVar33) * (dVar50 - dVar33);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = dVar7 + dVar8;
        auVar35 = vsqrtsd_avx(auVar66,auVar66);
        if ((auVar35._0_8_ <= dVar63) && (dVar52 <= dVar60)) {
          if (local_128 <= 0.0) {
            auVar20._8_8_ = 0x8000000000000000;
            auVar20._0_8_ = 0x8000000000000000;
            local_148 = vxorpd_avx512vl(auVar38,auVar20);
            bVar30 = true;
            if (local_120 <= 0.0) {
              auVar21._8_8_ = 0x8000000000000000;
              auVar21._0_8_ = 0x8000000000000000;
              auVar34 = vxorpd_avx512vl(auVar34,auVar21);
              auVar69 = ZEXT1664(auVar34);
            }
          }
          else {
            bVar30 = true;
            local_148 = auVar38;
            if (local_120 <= 0.0) {
              auVar19._8_8_ = 0x8000000000000000;
              auVar19._0_8_ = 0x8000000000000000;
              auVar34 = vxorpd_avx512vl(auVar34,auVar19);
              auVar69 = ZEXT1664(auVar34);
            }
          }
          goto LAB_00836b55;
        }
        dVar60 = (dVar52 - dVar60) * (dVar52 - dVar60);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = dVar8 + dVar60;
        auVar35 = vsqrtsd_avx(auVar65,auVar65);
        if ((dVar63 < auVar35._0_8_) || (dVar67 < dVar32)) {
          bVar30 = false;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar60 + dVar7;
          auVar34 = vsqrtsd_avx(auVar47,auVar47);
          local_138 = ZEXT816(0);
          if (dVar63 < auVar34._0_8_) {
            auVar69 = ZEXT1664(ZEXT816(0));
            local_148 = ZEXT816(0);
            goto LAB_00836b55;
          }
          auVar69 = ZEXT1664(ZEXT816(0));
          local_148 = ZEXT816(0);
          if (dVar33 < dVar50) goto LAB_00836b55;
          if (local_118 <= 0.0) {
            auVar25._8_8_ = 0x8000000000000000;
            auVar25._0_8_ = 0x8000000000000000;
            local_138 = vxorpd_avx512vl(auVar61,auVar25);
            if (local_128 <= 0.0) goto LAB_00836a7b;
          }
          else {
            local_138 = auVar61;
            if (local_128 <= 0.0) {
              auVar24._8_8_ = 0x8000000000000000;
              auVar24._0_8_ = 0x8000000000000000;
              local_148 = vxorpd_avx512vl(auVar38,auVar24);
              goto LAB_00836a85;
            }
          }
          goto LAB_00836b4b;
        }
        if (local_120 <= 0.0) {
          auVar22._8_8_ = 0x8000000000000000;
          auVar22._0_8_ = 0x8000000000000000;
          auVar34 = vxorpd_avx512vl(auVar34,auVar22);
          auVar69 = ZEXT1664(auVar34);
        }
        bVar30 = true;
        local_138 = auVar61;
        if (local_118 <= 0.0) {
          auVar23._8_8_ = 0x8000000000000000;
          auVar23._0_8_ = 0x8000000000000000;
          local_138 = vxorpd_avx512vl(auVar61,auVar23);
          goto LAB_00836b55;
        }
      }
      else {
        local_138 = auVar61;
        if (local_118 < 0.0) {
          auVar18._8_8_ = 0x8000000000000000;
          auVar18._0_8_ = 0x8000000000000000;
          local_138 = vxorpd_avx512vl(auVar61,auVar18);
        }
        auVar69 = ZEXT1664(auVar53);
      }
    }
    bVar30 = true;
  }
LAB_00836b55:
  ipoint = 1;
  do {
    dVar67 = auVar69._0_8_;
    if (bVar30) break;
    local_88 = auVar69._0_16_;
    geometry::ChBox::GetPn((ChVector<double> *)&local_f8,mgeo2,ipoint);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = (double)local_f8.geo1 - local_128;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = ((double)local_f8.geo2 - local_120) * ((double)local_f8.geo2 - local_120);
    auVar34 = vfmadd231sd_fma(auVar44,auVar41,auVar41);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_f8.p1.m_data[0] - local_118;
    auVar34 = vfmadd231sd_fma(auVar34,auVar48,auVar48);
    auVar34 = vsqrtsd_avx(auVar34,auVar34);
    auVar68 = local_88;
    if (auVar34._0_8_ <= mgeo1->rad) {
      geometry::ChBox::GetPn((ChVector<double> *)&local_f8,mgeo2,ipoint);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_f8.geo2;
      bVar30 = true;
      local_148._8_8_ = 0;
      local_148._0_8_ = local_f8.geo1;
      local_138._8_8_ = 0;
      local_138._0_8_ = local_f8.p1.m_data[0];
    }
    auVar69 = ZEXT1664(auVar68);
    dVar67 = auVar68._0_8_;
    ipoint = ipoint + 1;
  } while (ipoint != 9);
  if (!bVar30) {
    return 0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       dVar67 * (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar34 = vfmadd231sd_fma(auVar42,local_148,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar67 * (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar38 = vfmadd231sd_fma(auVar51,local_148,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       dVar67 * (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar53 = vfmadd231sd_fma(auVar56,local_148,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar34 = vfmadd231sd_fma(auVar34,local_138,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar38 = vfmadd231sd_fma(auVar38,local_138,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar53 = vfmadd231sd_fma(auVar53,local_138,auVar6);
  local_48.m_data[0] = T2->m_data[0] + auVar34._0_8_;
  local_48.m_data[1] = T2->m_data[1] + auVar38._0_8_;
  local_48.m_data[2] = T2->m_data[2] + auVar53._0_8_;
  local_60.m_data[1] = c1->m_data[1];
  local_60.m_data[0] = c1->m_data[0];
  local_60.m_data[2] = c1->m_data[2];
  dVar67 = local_48.m_data[1] - local_60.m_data[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_48.m_data[0] - local_60.m_data[0];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar67 * dVar67;
  auVar34 = vfmadd231sd_fma(auVar64,auVar43,auVar43);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_48.m_data[2] - local_60.m_data[2];
  auVar34 = vfmadd231sd_fma(auVar34,auVar57,auVar57);
  auVar34 = vsqrtsd_avx(auVar34,auVar34);
  bVar30 = 2.2250738585072014e-308 <= auVar34._0_8_;
  dVar63 = 1.0 / auVar34._0_8_;
  auVar36._0_8_ =
       (ulong)bVar30 * (long)(dVar63 * (local_48.m_data[0] - local_60.m_data[0])) +
       (ulong)!bVar30 * 0x3ff0000000000000;
  auVar36._8_8_ = 0;
  dVar67 = (double)((ulong)bVar30 * (long)(dVar63 * dVar67));
  uVar10 = (ulong)bVar30 * (long)(dVar63 * (local_48.m_data[2] - local_60.m_data[2]));
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar10;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = T2->m_data[0] - local_60.m_data[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (T2->m_data[1] - local_60.m_data[1]) * dVar67;
  auVar34 = vfmadd231sd_fma(auVar49,auVar36,auVar45);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = T2->m_data[2] - local_60.m_data[2];
  auVar34 = vfmadd231sd_fma(auVar34,auVar37,auVar58);
  bVar30 = auVar34._0_8_ < 0.0;
  dVar63 = (double)((ulong)bVar30 * (auVar36._0_8_ ^ 0x8000000000000000) + !bVar30 * auVar36._0_8_);
  dVar32 = (double)((ulong)bVar30 * (long)-dVar67 + (ulong)!bVar30 * (long)dVar67);
  dVar33 = (double)((ulong)bVar30 * (uVar10 ^ 0x8000000000000000) + !bVar30 * uVar10);
  dVar67 = mgeo1->rad;
  local_60.m_data[0] = local_60.m_data[0] + dVar63 * dVar67;
  local_60.m_data[2] = local_60.m_data[2] + dVar67 * dVar33;
  local_60.m_data[1] = local_60.m_data[1] + dVar67 * dVar32;
  local_6c.m_data[0] = (float)dVar63;
  local_6c.m_data[1] = (float)dVar32;
  local_6c.m_data[2] = (float)dVar33;
  local_f8.p1.m_data[0] = 0.0;
  local_f8.p1.m_data[1] = SUB328(ZEXT832(0),4);
  local_f8.p1.m_data[2] = 0.0;
  local_f8.p2.m_data[0]._0_4_ = 0;
  local_f8.p2.m_data[0]._4_4_ = 0;
  local_f8.p2.m_data[1] = 0.0;
  local_f8.p2.m_data[2] = 0.0;
  local_f8.normal.m_data[0] = 0.0;
  local_f8.normal.m_data[1] = 0.0;
  local_f8.normal.m_data[2] = 0.0;
  ChCollisionPair::Set
            (&local_f8,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2,&local_60,&local_48,&local_6c,
             (float *)0x0);
  dVar67 = local_f8.p1.m_data[2];
  if (swap_pairs) {
    local_f8._0_16_ = vpermilps_avx((undefined1  [16])local_f8._0_16_,0x4e);
    auVar31._8_8_ = local_f8.p2.m_data[2];
    auVar31._0_8_ = local_f8.p2.m_data[1];
    auVar31._16_4_ = local_f8.normal.m_data[0];
    auVar31._20_4_ = local_f8.normal.m_data[1];
    auVar31._24_4_ = local_f8.normal.m_data[2];
    auVar31._28_4_ = local_f8._76_4_;
    dVar63 = (double)CONCAT44(local_f8.p2.m_data[0]._4_4_,local_f8.p2.m_data[0]._0_4_);
    auVar9._8_8_ = local_f8.p1.m_data[1];
    auVar9._0_8_ = local_f8.p1.m_data[0];
    auVar9._16_8_ = local_f8.p1.m_data[2];
    auVar9._24_4_ = local_f8.p2.m_data[0]._0_4_;
    auVar9._28_4_ = local_f8.p2.m_data[0]._4_4_;
    auVar9 = vperm2f128_avx(auVar31,auVar9,0x20);
    local_f8.p1.m_data[1] = auVar9._0_8_;
    local_f8.p1.m_data[2] = auVar9._8_8_;
    local_f8.p2.m_data[0]._0_4_ = auVar9._16_4_;
    local_f8.p2.m_data[0]._4_4_ = auVar9._20_4_;
    local_f8.p2.m_data[1] = auVar9._24_8_;
    local_f8.p2.m_data[2] = dVar67;
    local_f8.normal.m_data[2] = -local_f8.normal.m_data[2];
    auVar46._0_8_ = local_f8.normal.m_data._0_8_ ^ 0x8000000080000000;
    auVar46._8_4_ = 0x80000000;
    auVar46._12_4_ = 0x80000000;
    local_f8.normal.m_data._0_8_ = vmovlps_avx(auVar46);
    local_f8.p1.m_data[0] = dVar63;
  }
  ChNarrowPhaseCollider::AddCollisionPair(mcollider,&local_f8);
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeSphereBoxCollisions(
    geometry::ChSphere& mgeo1,         ///< sphere
    Vector* c1,                        ///< absolute position of center
    geometry::ChBox& mgeo2,            ///< box
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box)
    Vector* T2,                        ///< absolute position of 2nd model (with box)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection,  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
    bool swap_pairs          ///< if true, pairs are reported as Triangle-Sphere (triangle will be the main ref.)
) {
    Vector relC = ChTransform<>::TransformParentToLocal(*c1, *T2, *R2);

    if (just_intersection) {
        if (((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <= mgeo1.rad) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad) &&
             (fabs(relC.x()) <= mgeo2.Size.x())) ||
            ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <= mgeo1.rad) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2) +
                   pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad))) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);

            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        Vector pt_loc;
        bool done = false;

        if ((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
            (fabs(relC.z()) <= mgeo2.Size.z())) {
            if (relC.x() >= 0) {
                pt_loc = relC;
                pt_loc.x() = mgeo2.Size.x();
                done = true;
            } else {
                pt_loc = relC;
                pt_loc.x() = -mgeo2.Size.x();
                done = true;
            }
        }
        if (!done) {
            if ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.z()) <= mgeo2.Size.z()) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() >= 0) {
                    pt_loc = relC;
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() >= 0) {
                    pt_loc = relC;
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.z()) <= mgeo2.Size.z())) {
                if (relC.x() > 0) {
                    if (relC.y() > 0) {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = mgeo2.Size.y();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = -mgeo2.Size.y();
                        done = true;
                    }
                } else if (relC.y() > 0) {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() > 0) {
                    if (relC.z() > 0) {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = mgeo2.Size.z();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = -mgeo2.Size.z();
                        done = true;
                    }
                } else if (relC.z() > 0) {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() > 0) {
                    if (relC.x() > 0) {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = mgeo2.Size.x();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = -mgeo2.Size.x();
                        done = true;
                    }
                } else if (relC.x() > 0) {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = mgeo2.Size.x();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = -mgeo2.Size.x();
                    done = true;
                }
            }
        }
        for (int i = 1; i <= 8; i++) {
            if (done)
                break;
            if (Vlength(mgeo2.GetPn(i) - relC) <= mgeo1.rad) {
                pt_loc = mgeo2.GetPn(i);
                done = true;
            }
        }

        if (done) {
            Vector pt_2 = ChTransform<>::TransformLocalToParent(pt_loc, *T2, *R2);
            Vector mnormal = Vnorm(pt_2 - *c1);
            if (Vdot(mnormal, *T2 - *c1) < 0)
                mnormal = -mnormal;
            Vector pt_1 = *c1 + (mnormal * mgeo1.rad);
            ChCollisionPair mcoll(&mgeo1, &mgeo2,  // geometries
                                  pt_1,            // p1
                                  pt_2,            // p2
                                  mnormal          // normal
            );
            if (swap_pairs)
                mcoll.SwapGeometries();
            mcollider.AddCollisionPair(&mcoll);
        }
    }

    return 0;
}